

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int i;
  int iVar3;
  char acVar4 [4];
  randomx_flags rVar5;
  randomx_flags rVar6;
  size_t sVar7;
  ostream *poVar8;
  code *pcVar9;
  unsigned_long uVar10;
  long lVar11;
  runtime_error *prVar12;
  undefined8 *puVar13;
  undefined8 in_RCX;
  char *pcVar14;
  pointer ptVar15;
  pointer_____offset_0x10___ *ppuVar16;
  undefined8 unaff_RBP;
  long lVar17;
  undefined8 uVar18;
  ulong uVar19;
  char *pcVar20;
  undefined4 uVar21;
  byte bVar22;
  uint uVar23;
  undefined4 uVar24;
  ulong unaff_R14;
  undefined **ppuVar25;
  char cVar26;
  ulong uVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  double dVar32;
  undefined1 auVar33 [16];
  uint32_t count;
  int noncesCount;
  undefined4 local_12c;
  randomx_flags local_128;
  uint local_124;
  undefined4 local_120;
  int local_11c;
  randomx_vm *vm;
  randomx_cache *cache;
  vector<randomx_vm_*,_std::allocator<randomx_vm_*>_> vms;
  int cpuid;
  atomic<unsigned_int> atomicNonce;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  uint64_t local_b0;
  uint32_t startItem;
  undefined4 uStack_a4;
  randomx_dataset *dataset;
  long local_98;
  reference_wrapper<std::atomic<unsigned_int>_> local_90;
  undefined4 local_84;
  undefined4 local_80;
  char seed [4];
  randomx_flags local_78;
  MineFunc *func;
  size_type local_68;
  undefined1 local_60 [16];
  AtomicHash result;
  
  if (argc < 1) {
LAB_00108476:
    lVar17 = 0;
  }
  else {
    iVar3 = strcmp(*argv,"--softAes");
    lVar17 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    if (iVar3 != 0) {
      unaff_R14 = (ulong)(uint)argc;
      uVar27 = 0;
      do {
        if (unaff_R14 - 1 == uVar27) goto LAB_00108476;
        iVar3 = strcmp(argv[uVar27 + 1],"--softAes");
        uVar27 = uVar27 + 1;
      } while (iVar3 != 0);
      if (unaff_R14 <= uVar27) goto LAB_00108476;
    }
  }
  if (argc < 1) {
LAB_001084c8:
    local_12c = 0;
  }
  else {
    iVar3 = strcmp(*argv,"--mine");
    in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),1);
    local_12c = (undefined4)in_RCX;
    if (iVar3 != 0) {
      unaff_R14 = (ulong)(uint)argc;
      uVar27 = 0;
      do {
        if (unaff_R14 - 1 == uVar27) goto LAB_001084c8;
        iVar3 = strcmp(argv[uVar27 + 1],"--mine");
        uVar27 = uVar27 + 1;
      } while (iVar3 != 0);
      if (unaff_R14 <= uVar27) goto LAB_001084c8;
    }
  }
  if (argc < 1) {
LAB_00108520:
    bVar30 = false;
  }
  else {
    iVar3 = strcmp(*argv,"--verify");
    in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),1);
    bVar30 = true;
    if (iVar3 != 0) {
      unaff_R14 = (ulong)(uint)argc;
      uVar27 = 0;
      do {
        if (unaff_R14 - 1 == uVar27) goto LAB_00108520;
        iVar3 = strcmp(argv[uVar27 + 1],"--verify");
        uVar27 = uVar27 + 1;
      } while (iVar3 != 0);
      if (unaff_R14 <= uVar27) goto LAB_00108520;
    }
  }
  local_84 = (undefined4)lVar17;
  if (1 < argc) {
    uVar23 = argc - 1;
    unaff_R14 = -(ulong)uVar23;
    lVar17 = CONCAT71((int7)((ulong)lVar17 >> 8),1);
    uVar27 = 1;
    do {
      iVar3 = strcmp(argv[uVar27 - 1],"--threads");
      if ((iVar3 == 0) && (local_11c = atoi(argv[uVar27]), 0 < local_11c)) {
        if ((char)lVar17 != '\0') goto LAB_00108594;
        break;
      }
      lVar17 = CONCAT71((int7)((ulong)lVar17 >> 8),(long)uVar27 < (long)(int)uVar23);
      bVar28 = uVar27 != uVar23;
      uVar27 = uVar27 + 1;
    } while (bVar28);
  }
  local_11c = 1;
LAB_00108594:
  if (1 < argc) {
    uVar23 = argc - 1;
    unaff_R14 = -(ulong)uVar23;
    lVar17 = CONCAT71((int7)((ulong)lVar17 >> 8),1);
    uVar27 = 1;
    do {
      iVar3 = strcmp(argv[uVar27 - 1],"--affinity");
      if ((iVar3 == 0) && (local_b0 = strtoull(argv[uVar27],(char **)0x0,0), local_b0 != 0)) {
        if ((char)lVar17 != '\0') goto LAB_00108602;
        break;
      }
      lVar17 = CONCAT71((int7)((ulong)lVar17 >> 8),(long)uVar27 < (long)(int)uVar23);
      bVar28 = uVar27 != uVar23;
      uVar27 = uVar27 + 1;
    } while (bVar28);
  }
  local_b0 = 0;
LAB_00108602:
  if (1 < argc) {
    uVar23 = argc - 1;
    unaff_R14 = -(ulong)uVar23;
    lVar17 = CONCAT71((int7)((ulong)lVar17 >> 8),1);
    uVar27 = 1;
    do {
      iVar3 = strcmp(argv[uVar27 - 1],"--nonces");
      if ((iVar3 == 0) && (noncesCount = atoi(argv[uVar27]), 0 < noncesCount)) {
        if ((char)lVar17 != '\0') goto LAB_0010866b;
        break;
      }
      lVar17 = CONCAT71((int7)((ulong)lVar17 >> 8),(long)uVar27 < (long)(int)uVar23);
      bVar28 = uVar27 != uVar23;
      uVar27 = uVar27 + 1;
    } while (bVar28);
  }
  noncesCount = 1000;
LAB_0010866b:
  if (1 < argc) {
    uVar23 = argc - 1;
    lVar17 = (long)(int)uVar23;
    unaff_R14 = -(ulong)uVar23;
    bVar28 = true;
    uVar27 = 1;
    do {
      iVar3 = strcmp(argv[uVar27 - 1],"--init");
      if ((iVar3 == 0) && (local_124 = atoi(argv[uVar27]), 0 < (int)local_124)) {
        if (bVar28) goto LAB_001086cd;
        break;
      }
      bVar28 = (long)uVar27 < lVar17;
      bVar29 = uVar27 != uVar23;
      uVar27 = uVar27 + 1;
    } while (bVar29);
  }
  local_124 = 1;
LAB_001086cd:
  if (1 < argc) {
    uVar23 = argc - 1;
    lVar17 = (long)(int)uVar23;
    unaff_R14 = -(ulong)uVar23;
    bVar28 = true;
    uVar27 = 1;
    do {
      iVar3 = strcmp(argv[uVar27 - 1],"--seed");
      if ((iVar3 == 0) && (acVar4 = (char  [4])atoi(argv[uVar27]), 0 < (int)acVar4)) {
        if (bVar28) goto LAB_00108730;
        break;
      }
      bVar28 = (long)uVar27 < lVar17;
      bVar29 = uVar27 != uVar23;
      uVar27 = uVar27 + 1;
    } while (bVar29);
  }
  acVar4[0] = '\0';
  acVar4[1] = '\0';
  acVar4[2] = '\0';
  acVar4[3] = '\0';
LAB_00108730:
  if (argc < 1) {
LAB_00108781:
    uVar18 = 0;
  }
  else {
    iVar3 = strcmp(*argv,"--largePages");
    uVar18 = CONCAT71((int7)((ulong)lVar17 >> 8),1);
    if (iVar3 != 0) {
      unaff_R14 = (ulong)(uint)argc;
      uVar27 = 0;
      do {
        if (unaff_R14 - 1 == uVar27) goto LAB_00108781;
        iVar3 = strcmp(argv[uVar27 + 1],"--largePages");
        uVar27 = uVar27 + 1;
      } while (iVar3 != 0);
      if (unaff_R14 <= uVar27) goto LAB_00108781;
    }
  }
  rVar5 = (randomx_flags)uVar18;
  if ((char)uVar18 == '\0') {
    if (argc < 1) {
LAB_001087d5:
      rVar5 = RANDOMX_FLAG_DEFAULT;
    }
    else {
      iVar3 = strcmp(*argv,"--largepages");
      rVar5 = (randomx_flags)CONCAT71((int7)((ulong)uVar18 >> 8),1);
      if (iVar3 != 0) {
        unaff_R14 = (ulong)(uint)argc;
        uVar27 = 0;
        do {
          if (unaff_R14 - 1 == uVar27) goto LAB_001087d5;
          iVar3 = strcmp(argv[uVar27 + 1],"--largepages");
          uVar27 = uVar27 + 1;
        } while (iVar3 != 0);
        if (unaff_R14 <= uVar27) goto LAB_001087d5;
      }
    }
  }
  if (argc < 1) {
LAB_00108827:
    bVar28 = false;
  }
  else {
    iVar3 = strcmp(*argv,"--jit");
    in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),1);
    bVar28 = true;
    if (iVar3 != 0) {
      unaff_R14 = (ulong)(uint)argc;
      uVar27 = 0;
      do {
        if (unaff_R14 - 1 == uVar27) goto LAB_00108827;
        iVar3 = strcmp(argv[uVar27 + 1],"--jit");
        uVar27 = uVar27 + 1;
      } while (iVar3 != 0);
      if (unaff_R14 <= uVar27) goto LAB_00108827;
    }
  }
  local_128 = rVar5;
  if (argc < 1) {
LAB_00108880:
    uVar18 = 0;
  }
  else {
    iVar3 = strcmp(*argv,"--help");
    uVar18 = CONCAT71((int7)(unaff_R14 >> 8),1);
    if (iVar3 != 0) {
      uVar27 = 0;
      do {
        if ((ulong)(uint)argc - 1 == uVar27) goto LAB_00108880;
        iVar3 = strcmp(argv[uVar27 + 1],"--help");
        uVar27 = uVar27 + 1;
      } while (iVar3 != 0);
      if ((uint)argc <= uVar27) goto LAB_00108880;
    }
  }
  local_98 = CONCAT44(local_98._4_4_,(int)uVar18);
  if (argc < 1) {
LAB_001088d8:
    uVar24 = 0;
  }
  else {
    iVar3 = strcmp(*argv,"--secure");
    uVar24 = (undefined4)CONCAT71((int7)((ulong)uVar18 >> 8),1);
    if (iVar3 != 0) {
      uVar27 = 0;
      do {
        if ((ulong)(uint)argc - 1 == uVar27) goto LAB_001088d8;
        iVar3 = strcmp(argv[uVar27 + 1],"--secure");
        uVar27 = uVar27 + 1;
      } while (iVar3 != 0);
      if ((uint)argc <= uVar27) goto LAB_001088d8;
    }
  }
  if (argc < 1) {
LAB_00108932:
    local_78 = RANDOMX_FLAG_DEFAULT;
  }
  else {
    iVar3 = strcmp(*argv,"--ssse3");
    in_RCX = 0;
    local_78 = RANDOMX_FLAG_ARGON2_SSSE3;
    if (iVar3 != 0) {
      uVar27 = 0;
      do {
        if ((ulong)(uint)argc - 1 == uVar27) goto LAB_00108932;
        iVar3 = strcmp(argv[uVar27 + 1],"--ssse3");
        uVar27 = uVar27 + 1;
      } while (iVar3 != 0);
      if ((uint)argc <= uVar27) goto LAB_00108932;
    }
  }
  if (argc < 1) {
LAB_0010898e:
    bVar29 = false;
  }
  else {
    iVar3 = strcmp(*argv,"--avx2");
    in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),1);
    bVar29 = true;
    if (iVar3 != 0) {
      uVar27 = 0;
      do {
        if ((ulong)(uint)argc - 1 == uVar27) goto LAB_0010898e;
        iVar3 = strcmp(argv[uVar27 + 1],"--avx2");
        uVar27 = uVar27 + 1;
      } while (iVar3 != 0);
      if ((uint)argc <= uVar27) goto LAB_0010898e;
    }
  }
  local_80 = uVar24;
  if (argc < 1) {
LAB_001089eb:
    bVar1 = false;
  }
  else {
    iVar3 = strcmp(*argv,"--auto");
    bVar1 = true;
    if (iVar3 != 0) {
      uVar27 = 0;
      do {
        if ((ulong)(uint)argc - 1 == uVar27) goto LAB_001089eb;
        iVar3 = strcmp(argv[uVar27 + 1],"--auto");
        uVar27 = uVar27 + 1;
      } while (iVar3 != 0);
      if ((uint)argc <= uVar27) goto LAB_001089eb;
    }
  }
  if (argc < 1) {
LAB_00108a3d:
    bVar2 = false;
  }
  else {
    iVar3 = strcmp(*argv,"--noBatch");
    in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),1);
    bVar2 = true;
    if (iVar3 != 0) {
      uVar27 = 0;
      do {
        if ((ulong)(uint)argc - 1 == uVar27) goto LAB_00108a3d;
        iVar3 = strcmp(argv[uVar27 + 1],"--noBatch");
        uVar27 = uVar27 + 1;
      } while (iVar3 != 0);
      if ((uint)argc <= uVar27) goto LAB_00108a3d;
    }
  }
  if (argc < 1) {
LAB_00108a95:
    local_120 = 0;
  }
  else {
    iVar3 = strcmp(*argv,"--commit");
    local_120 = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),1);
    if (iVar3 != 0) {
      uVar27 = 0;
      do {
        if ((ulong)(uint)argc - 1 == uVar27) goto LAB_00108a95;
        iVar3 = strcmp(argv[uVar27 + 1],"--commit");
        uVar27 = uVar27 + 1;
      } while (iVar3 != 0);
      if ((uint)argc <= uVar27) goto LAB_00108a95;
    }
  }
  seed = acVar4;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"RandomX benchmark v1.2.1",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  uVar21 = local_120;
  uVar24 = local_12c;
  if ((char)local_98 != '\0') {
    printUsage(*argv);
    return 0;
  }
  cVar26 = (char)local_12c;
  if (!bVar30 && cVar26 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Please select either the fast mode (--mine) or the slow mode (--verify)",0x47);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Run \'",5);
    pcVar14 = *argv;
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x124130);
    }
    else {
      sVar7 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar14,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," --help\' to see all supported options",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    return 0;
  }
  atomicNonce.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0;
  lVar17 = 0;
  do {
    LOCK();
    result.hash[lVar17].super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    lVar17 = lVar17 + 1;
  } while (lVar17 != 4);
  vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar1) {
    local_124 = std::thread::hardware_concurrency();
    rVar5 = randomx_get_flags();
  }
  else {
    rVar5 = local_78 + RANDOMX_FLAG_ARGON2_AVX2;
    if (!bVar29) {
      rVar5 = local_78;
    }
    rVar6 = rVar5 | RANDOMX_FLAG_HARD_AES;
    if ((char)local_84 != '\0') {
      rVar6 = rVar5;
    }
    rVar5 = rVar6 | RANDOMX_FLAG_JIT;
    if (!bVar28) {
      rVar5 = rVar6;
    }
  }
  rVar5 = local_128 & 0xff | rVar5;
  rVar6 = rVar5 | RANDOMX_FLAG_FULL_MEM;
  if (cVar26 == '\0') {
    rVar6 = rVar5;
  }
  rVar5 = rVar6 | RANDOMX_FLAG_SECURE;
  if ((char)local_80 == '\0') {
    rVar5 = rVar6;
  }
  bVar30 = (rVar5 & RANDOMX_FLAG_ARGON2_SSSE3) == RANDOMX_FLAG_DEFAULT;
  pcVar14 = " - Argon2 implementation: SSSE3";
  if (bVar30) {
    pcVar14 = " - Argon2 implementation: reference";
  }
  bVar28 = (rVar5 & RANDOMX_FLAG_ARGON2_AVX2) == RANDOMX_FLAG_DEFAULT;
  pcVar20 = " - Argon2 implementation: AVX2";
  if (bVar28) {
    pcVar20 = pcVar14;
  }
  lVar17 = 0x1e;
  if (bVar28) {
    lVar17 = (ulong)bVar30 * 4 + 0x1f;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar20,lVar17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  pcVar14 = " - full memory mode (2080 MiB)";
  if ((rVar5 & RANDOMX_FLAG_FULL_MEM) == RANDOMX_FLAG_DEFAULT) {
    pcVar14 = " - light memory mode (256 MiB)";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar14,0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  if ((rVar5 & RANDOMX_FLAG_JIT) == RANDOMX_FLAG_DEFAULT) {
    lVar17 = 0x13;
    pcVar14 = " - interpreted mode";
LAB_00108daf:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar14,lVar17);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," - JIT compiled mode ",0x15);
    if ((rVar5 & RANDOMX_FLAG_SECURE) != RANDOMX_FLAG_DEFAULT) {
      lVar17 = 8;
      pcVar14 = "(secure)";
      goto LAB_00108daf;
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  pcVar14 = " - hardware AES mode";
  if ((rVar5 & RANDOMX_FLAG_HARD_AES) == RANDOMX_FLAG_DEFAULT) {
    pcVar14 = " - software AES mode";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar14,0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  pcVar14 = " - large pages mode";
  if ((rVar5 & RANDOMX_FLAG_LARGE_PAGES) == RANDOMX_FLAG_DEFAULT) {
    pcVar14 = " - small pages mode";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar14,0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  if (local_b0 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," - thread affinity (",0x14);
    mask_to_string_abi_cxx11_((string *)&func,local_b0);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)func,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if (func != (MineFunc *)local_60) {
      operator_delete(func);
    }
  }
  if (bVar2) {
    if ((char)uVar21 == '\0') {
      pcVar9 = mine<false,false>;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," - hash commitments",0x13);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
LAB_00108fd8:
      pcVar9 = mine<false,true>;
    }
  }
  else {
    if ((char)uVar21 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," - hash commitments",0x13);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      goto LAB_00108fd8;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," - batch mode",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    pcVar9 = mine<true,false>;
  }
  func = pcVar9;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Initializing",0xc);
  if (cVar26 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_124);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," thread",7);
    pcVar14 = ")";
    if (1 < (int)local_124) {
      pcVar14 = "s)";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,pcVar14,(ulong)(1 < (int)local_124) + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ...",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  if ((rVar5 & RANDOMX_FLAG_ARGON2_AVX2) == RANDOMX_FLAG_DEFAULT) {
    if ((rVar5 & RANDOMX_FLAG_ARGON2_SSSE3) == RANDOMX_FLAG_DEFAULT) {
      pcVar9 = randomx_argon2_fill_segment_ref;
    }
    else {
      pcVar9 = randomx_argon2_impl_ssse3();
    }
  }
  else {
    pcVar9 = randomx_argon2_impl_avx2();
  }
  if (pcVar9 == (randomx_argon2_impl *)0x0) {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,"Unsupported Argon2 implementation");
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((rVar5 & RANDOMX_FLAG_JIT) == RANDOMX_FLAG_DEFAULT) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "WARNING: You are using the interpreter mode. Use --jit for optimal performance.",
               0x4f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
  }
  lVar17 = std::chrono::_V2::system_clock::now();
  cache = randomx_alloc_cache(rVar5);
  if (cache == (randomx_cache *)0x0) {
    ppuVar16 = &CacheAllocException::typeinfo;
    ppuVar25 = &PTR__exception_00120ef0;
LAB_001099e6:
    puVar13 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar13 = ppuVar25;
    __cxa_throw(puVar13,ppuVar16,std::exception::~exception);
  }
  randomx_init_cache(cache,seed,4);
  if (cVar26 != '\0') {
    dataset = randomx_alloc_dataset(rVar5);
    if (dataset == (randomx_dataset *)0x0) {
      ppuVar16 = &DatasetAllocException::typeinfo;
      ppuVar25 = &PTR__exception_00120f18;
      dataset = (randomx_dataset *)0x0;
      goto LAB_001099e6;
    }
    uVar10 = randomx_dataset_item_count();
    if ((int)local_124 < 2) {
      randomx_init_dataset(dataset,cache,0,uVar10 & 0xffffffff);
    }
    else {
      uVar27 = (ulong)local_124;
      _startItem = (AtomicHash *)((ulong)_startItem & 0xffffffff00000000);
      uVar23 = local_124;
      local_12c = uVar24;
      local_98 = lVar17;
      do {
        iVar3 = 0;
        if (uVar23 == 1) {
          iVar3 = (int)((uVar10 & 0xffffffff) % uVar27);
        }
        count = iVar3 + (int)((uVar10 & 0xffffffff) / uVar27);
        local_90._M_data = (atomic<unsigned_int> *)randomx_init_dataset;
        std::thread::
        thread<void(*)(randomx_dataset*,randomx_cache*,unsigned_long,unsigned_long),randomx_dataset*&,randomx_cache*&,unsigned_int&,unsigned_int&,void>
                  ((thread *)&vm,
                   (_func_void_randomx_dataset_ptr_randomx_cache_ptr_unsigned_long_unsigned_long **)
                   &local_90,&dataset,&cache,&startItem,&count);
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  (&threads,(thread *)&vm);
        uVar21 = local_120;
        uVar24 = local_12c;
        if (vm != (randomx_vm *)0x0) {
          std::terminate();
        }
        startItem = startItem + count;
        uVar23 = uVar23 - 1;
      } while (uVar23 != 0);
      lVar17 = local_98;
      if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar27 = 1;
        do {
          std::thread::join();
          bVar30 = uVar27 < (ulong)((long)threads.
                                          super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)threads.
                                          super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar27 = (ulong)((int)uVar27 + 1);
          lVar17 = local_98;
        } while (bVar30);
      }
    }
    randomx_release_cache(cache);
    cache = (randomx_cache *)0x0;
    ptVar15 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        if ((ptVar15->_M_id)._M_thread != 0) {
          std::terminate();
        }
        ptVar15 = ptVar15 + 1;
      } while (ptVar15 !=
               threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish =
           threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Memory initialized in ",0x16);
  lVar11 = std::chrono::_V2::system_clock::now();
  lVar11 = lVar11 - lVar17;
  auVar33._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar33._0_8_ = lVar11;
  auVar33._12_4_ = 0x45300000;
  poVar8 = std::ostream::_M_insert<double>
                     (((auVar33._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) /
                      1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," s",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Initializing ",0xd);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_11c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," virtual machine(s) ...",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  iVar3 = local_11c;
  do {
    vm = randomx_create_vm(rVar5,cache,dataset);
    if (vm == (randomx_vm *)0x0) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      if ((rVar5 & RANDOMX_FLAG_HARD_AES) == RANDOMX_FLAG_DEFAULT) {
        if ((undefined1)local_128 == '\0') {
          std::runtime_error::runtime_error(prVar12,"Cannot create VM");
        }
        else {
          std::runtime_error::runtime_error
                    (prVar12,"Cannot create VM with the selected options. Try without --largePages")
          ;
        }
      }
      else {
        std::runtime_error::runtime_error
                  (prVar12,"Cannot create VM with the selected options. Try using --softAes");
      }
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<randomx_vm*,std::allocator<randomx_vm*>>::_M_realloc_insert<randomx_vm*const&>
                ((vector<randomx_vm*,std::allocator<randomx_vm*>> *)&vms,
                 (iterator)
                 vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,&vm);
    }
    else {
      *vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
       super__Vector_impl_data._M_finish = vm;
      vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running benchmark (",0x13);
  bVar22 = (byte)uVar21;
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,noncesCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," nonces) ...",0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  lVar17 = std::chrono::_V2::system_clock::now();
  if (local_11c < 2) {
    (*func)(*vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
             super__Vector_impl_data._M_start,&atomicNonce,&result,noncesCount,0,-1);
  }
  else {
    count = 0;
    if (vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        cpuid = -1;
        if (local_b0 != 0) {
          cpuid = cpuid_from_mask(local_b0,&count);
        }
        local_90._M_data = &atomicNonce;
        _startItem = &result;
        std::thread::
        thread<void(*&)(randomx_vm*,std::atomic<unsigned_int>&,AtomicHash&,unsigned_int,int,int),randomx_vm*&,std::reference_wrapper<std::atomic<unsigned_int>>,std::reference_wrapper<AtomicHash>,int&,unsigned_int&,int&,void>
                  ((thread *)&vm,
                   (_func_void_randomx_vm_ptr_atomic<unsigned_int>_ptr_AtomicHash_ptr_uint_int_int
                    **)&func,
                   vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
                   super__Vector_impl_data._M_start + count,&local_90,
                   (reference_wrapper<AtomicHash> *)&startItem,&noncesCount,&count,&cpuid);
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  (&threads,(thread *)&vm);
        if (vm != (randomx_vm *)0x0) {
          std::terminate();
        }
        count = count + 1;
      } while ((ulong)count <
               (ulong)((long)vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3));
    }
    uVar24 = local_12c;
    bVar22 = (byte)local_120;
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar27 = 1;
      do {
        std::thread::join();
        bVar30 = uVar27 < (ulong)((long)threads.
                                        super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)threads.
                                        super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar27 = (ulong)((int)uVar27 + 1);
      } while (bVar30);
    }
  }
  lVar11 = std::chrono::_V2::system_clock::now();
  if (vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar27 = 0;
    uVar19 = 1;
    do {
      randomx_destroy_vm(vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl
                         .super__Vector_impl_data._M_start[uVar27]);
      bVar30 = uVar19 < (ulong)((long)vms.
                                      super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)vms.
                                      super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar27 = uVar19;
      uVar19 = (ulong)((int)uVar19 + 1);
    } while (bVar30);
  }
  if ((char)uVar24 == '\0') {
    randomx_release_cache(cache);
  }
  else {
    randomx_release_dataset(dataset);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Calculated result: ",0x13);
  AtomicHash::print(&result,(ostream *)&std::cout);
  if (((noncesCount != 1000 || acVar4 != (char  [4])0x0) | bVar22) == 1) {
    if (bVar22 != 0 || (acVar4 != (char  [4])0x0 || noncesCount != 10)) goto LAB_001097ee;
    pcVar14 = "Reference result:  8416fe0d17607f6ec811e7b7dfcf6cd384f7ef3cbfb9ff56ef906a918c9d9b0d";
  }
  else {
    pcVar14 = "Reference result:  2ef524aee58abcceeb488b28116f6d357411788ded7bdff2fed07002ce7ae987";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar14,0x53);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
LAB_001097ee:
  lVar11 = lVar11 - lVar17;
  auVar31._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar31._0_8_ = lVar11;
  auVar31._12_4_ = 0x45300000;
  dVar32 = ((auVar31._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) / 1000000000.0;
  if ((char)uVar24 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Performance: ",0xd);
    poVar8 = std::ostream::_M_insert<double>((dVar32 * 1000.0) / (double)noncesCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ms per hash",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Performance: ",0xd);
    poVar8 = std::ostream::_M_insert<double>((double)noncesCount / dVar32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," hashes per second",0x12);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  }
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  if (vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	bool softAes, miningMode, verificationMode, help, largePages, jit, secure, commit;
	bool ssse3, avx2, autoFlags, noBatch;
	int noncesCount, threadCount, initThreadCount;
	uint64_t threadAffinity;
	int32_t seedValue;
	char seed[4];

	readOption("--softAes", argc, argv, softAes);
	readOption("--mine", argc, argv, miningMode);
	readOption("--verify", argc, argv, verificationMode);
	readIntOption("--threads", argc, argv, threadCount, 1);
	readUInt64Option("--affinity", argc, argv, threadAffinity, 0);
	readIntOption("--nonces", argc, argv, noncesCount, 1000);
	readIntOption("--init", argc, argv, initThreadCount, 1);
	readIntOption("--seed", argc, argv, seedValue, 0);
	readOption("--largePages", argc, argv, largePages);
	if (!largePages) {
		readOption("--largepages", argc, argv, largePages);
	}
	readOption("--jit", argc, argv, jit);
	readOption("--help", argc, argv, help);
	readOption("--secure", argc, argv, secure);
	readOption("--ssse3", argc, argv, ssse3);
	readOption("--avx2", argc, argv, avx2);
	readOption("--auto", argc, argv, autoFlags);
	readOption("--noBatch", argc, argv, noBatch);
	readOption("--commit", argc, argv, commit);

	store32(&seed, seedValue);

	std::cout << "RandomX benchmark v1.2.1" << std::endl;

	if (help) {
		printUsage(argv[0]);
		return 0;
	}

	if (!miningMode && !verificationMode) {
		std::cout << "Please select either the fast mode (--mine) or the slow mode (--verify)" << std::endl;
		std::cout << "Run '" << argv[0] << " --help' to see all supported options" << std::endl;
		return 0;
	}

	std::atomic<uint32_t> atomicNonce(0);
	AtomicHash result;
	std::vector<randomx_vm*> vms;
	std::vector<std::thread> threads;
	randomx_dataset* dataset;
	randomx_cache* cache;
	randomx_flags flags;

	if (autoFlags) {
		initThreadCount = std::thread::hardware_concurrency();
		flags = randomx_get_flags();
	}
	else {
		flags = RANDOMX_FLAG_DEFAULT;
		if (ssse3) {
			flags |= RANDOMX_FLAG_ARGON2_SSSE3;
		}
		if (avx2) {
			flags |= RANDOMX_FLAG_ARGON2_AVX2;
		}
		if (!softAes) {
			flags |= RANDOMX_FLAG_HARD_AES;
		}
		if (jit) {
			flags |= RANDOMX_FLAG_JIT;
#ifdef RANDOMX_FORCE_SECURE
			flags |= RANDOMX_FLAG_SECURE;
#endif
		}
	}

	if (largePages) {
		flags |= RANDOMX_FLAG_LARGE_PAGES;
	}
	if (miningMode) {
		flags |= RANDOMX_FLAG_FULL_MEM;
	}
#ifndef RANDOMX_FORCE_SECURE
	if (secure) {
		flags |= RANDOMX_FLAG_SECURE;
	}
#endif

	if (flags & RANDOMX_FLAG_ARGON2_AVX2) {
		std::cout << " - Argon2 implementation: AVX2" << std::endl;
	}
	else if (flags & RANDOMX_FLAG_ARGON2_SSSE3) {
		std::cout << " - Argon2 implementation: SSSE3" << std::endl;
	}
	else {
		std::cout << " - Argon2 implementation: reference" << std::endl;
	}

	if (flags & RANDOMX_FLAG_FULL_MEM) {
		std::cout << " - full memory mode (2080 MiB)" << std::endl;
	}
	else {
		std::cout << " - light memory mode (256 MiB)" << std::endl;
	}

	if (flags & RANDOMX_FLAG_JIT) {
		std::cout << " - JIT compiled mode ";
		if (flags & RANDOMX_FLAG_SECURE) {
			std::cout << "(secure)";
		}
		std::cout << std::endl;
	}
	else {
		std::cout << " - interpreted mode" << std::endl;
	}

	if (flags & RANDOMX_FLAG_HARD_AES) {
		std::cout << " - hardware AES mode" << std::endl;
	}
	else {
		std::cout << " - software AES mode" << std::endl;
	}

	if (flags & RANDOMX_FLAG_LARGE_PAGES) {
		std::cout << " - large pages mode" << std::endl;
	}
	else {
		std::cout << " - small pages mode" << std::endl;
	}

	if (threadAffinity) {
		std::cout << " - thread affinity (" << mask_to_string(threadAffinity) << ")" << std::endl;
	}

	MineFunc* func;

	if (noBatch) {
		if (commit) {
			std::cout << " - hash commitments" << std::endl;
			func = &mine<false, true>;
		}
		else {
			func = &mine<false, false>;
		}
	}
	else {
		if (commit) {
			//TODO: support batch mode with commitments
			std::cout << " - hash commitments" << std::endl;
			func = &mine<false, true>;
		}
		else {
			std::cout << " - batch mode" << std::endl;
			func = &mine<true, false>;
		}
	}

	std::cout << "Initializing";
	if (miningMode)
		std::cout << " (" << initThreadCount << " thread" << (initThreadCount > 1 ? "s)" : ")");
	std::cout << " ..." << std::endl;

	try {
		if (nullptr == randomx::selectArgonImpl(flags)) {
			throw std::runtime_error("Unsupported Argon2 implementation");
		}
		if ((flags & RANDOMX_FLAG_JIT) && !RANDOMX_HAVE_COMPILER) {
			throw std::runtime_error("JIT compilation is not supported on this platform. Try without --jit");
		}
		if (!(flags & RANDOMX_FLAG_JIT) && RANDOMX_HAVE_COMPILER) {
			std::cout << "WARNING: You are using the interpreter mode. Use --jit for optimal performance." << std::endl;
		}

		Stopwatch sw(true);
		cache = randomx_alloc_cache(flags);
		if (cache == nullptr) {
			throw CacheAllocException();
		}
		randomx_init_cache(cache, &seed, sizeof(seed));
		if (miningMode) {
			dataset = randomx_alloc_dataset(flags);
			if (dataset == nullptr) {
				throw DatasetAllocException();
			}
			uint32_t datasetItemCount = randomx_dataset_item_count();
			if (initThreadCount > 1) {
				auto perThread = datasetItemCount / initThreadCount;
				auto remainder = datasetItemCount % initThreadCount;
				uint32_t startItem = 0;
				for (int i = 0; i < initThreadCount; ++i) {
					auto count = perThread + (i == initThreadCount - 1 ? remainder : 0);
					threads.push_back(std::thread(&randomx_init_dataset, dataset, cache, startItem, count));
					startItem += count;
				}
				for (unsigned i = 0; i < threads.size(); ++i) {
					threads[i].join();
				}
			}
			else {
				randomx_init_dataset(dataset, cache, 0, datasetItemCount);
			}
			randomx_release_cache(cache);
			cache = nullptr;
			threads.clear();
		}
		std::cout << "Memory initialized in " << sw.getElapsed() << " s" << std::endl;
		std::cout << "Initializing " << threadCount << " virtual machine(s) ..." << std::endl;
		for (int i = 0; i < threadCount; ++i) {
			randomx_vm *vm = randomx_create_vm(flags, cache, dataset);
			if (vm == nullptr) {
				if ((flags & RANDOMX_FLAG_HARD_AES)) {
					throw std::runtime_error("Cannot create VM with the selected options. Try using --softAes");
				}
				if (largePages) {
					throw std::runtime_error("Cannot create VM with the selected options. Try without --largePages");
				}
				throw std::runtime_error("Cannot create VM");
			}
			vms.push_back(vm);
		}
		std::cout << "Running benchmark (" << noncesCount << " nonces) ..." << std::endl;
		sw.restart();
		if (threadCount > 1) {
			for (unsigned i = 0; i < vms.size(); ++i) {
				int cpuid = -1;
				if (threadAffinity)
					cpuid = cpuid_from_mask(threadAffinity, i);
				threads.push_back(std::thread(func, vms[i], std::ref(atomicNonce), std::ref(result), noncesCount, i, cpuid));
			}
			for (unsigned i = 0; i < threads.size(); ++i) {
				threads[i].join();
			}
		}
		else {
			func(vms[0], std::ref(atomicNonce), std::ref(result), noncesCount, 0, -1);
		}

		double elapsed = sw.getElapsed();
		for (unsigned i = 0; i < vms.size(); ++i)
			randomx_destroy_vm(vms[i]);
		if (miningMode)
			randomx_release_dataset(dataset);
		else
			randomx_release_cache(cache);
		std::cout << "Calculated result: ";
		result.print(std::cout);
		if (noncesCount == 1000 && seedValue == 0 && !commit)
			std::cout << "Reference result:  2ef524aee58abcceeb488b28116f6d357411788ded7bdff2fed07002ce7ae987" << std::endl;
		else if (noncesCount == 10 && seedValue == 0 && !commit)
			std::cout << "Reference result:  8416fe0d17607f6ec811e7b7dfcf6cd384f7ef3cbfb9ff56ef906a918c9d9b0d" << std::endl;
		if (!miningMode) {
			std::cout << "Performance: " << 1000 * elapsed / noncesCount << " ms per hash" << std::endl;
		}
		else {
			std::cout << "Performance: " << noncesCount / elapsed << " hashes per second" << std::endl;
		}
	}
	catch (MemoryException& e) {
		std::cout << "ERROR: " << e.what() << std::endl;
		if (largePages) {
#ifdef _WIN32
			std::cout << "To use large pages, please enable the \"Lock Pages in Memory\" policy and reboot." << std::endl;
			if (!IsWindows8OrGreater()) {
				std::cout << "Additionally, you have to run the benchmark from elevated command prompt." << std::endl;
			}
#else
			std::cout << "To use large pages, please run: sudo sysctl -w vm.nr_hugepages=1250" << std::endl;
#endif
		}
		return 1;
	}
	catch (std::exception& e) {
		std::cout << "ERROR: " << e.what() << std::endl;
		return 1;
	}
	return 0;
}